

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_octal_integer_abi_cxx11_
          (result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  source_ptr *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_iterator rollback;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  value_type *pvVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string str;
  integer retval;
  result<toml::detail::region,_toml::detail::none_t> token;
  istringstream iss;
  allocator_type local_369;
  string local_368;
  undefined1 local_348 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_330;
  undefined1 local_328 [32];
  string local_308;
  _Alloc_hider local_2e8;
  undefined1 local_2e0 [8];
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  source_ptr *local_290;
  undefined1 local_288 [72];
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_240;
  undefined1 local_228 [8];
  undefined1 local_220 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  _Alloc_hider local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  ios_base local_128 [264];
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::sequence<toml::detail::character<'0'>,_toml::detail::character<'o'>_>,_toml::detail::sequence<toml::detail::in_range<'0',_'7'>,_toml::detail::repeat<toml::detail::either<toml::detail::in_range<'0',_'7'>,_toml::detail::sequence<toml::detail::character<'_'>,_toml::detail::in_range<'0',_'7'>_>_>,_toml::detail::unlimited>_>_>
  ::invoke((result<toml::detail::region,_toml::detail::none_t> *)&local_290,(location *)this);
  if (local_290._0_1_ == true) {
    pvVar7 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                       ((result<toml::detail::region,_toml::detail::none_t> *)&local_290);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (&local_368,(detail *)(pvVar7->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar7->last_)._M_current,in_RCX);
    local_1a0.first.line_num_._0_1_ = 0x5f;
    _Var8 = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )local_368._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_368._M_dataplus._M_p + local_368._M_string_length),
                       (_Iter_equals_val<const_char>)&local_1a0);
    local_368._M_string_length = (long)_Var8._M_current - (long)local_368._M_dataplus._M_p;
    *_Var8._M_current = '\0';
    std::__cxx11::string::_M_erase((ulong)&local_368,0);
    std::__cxx11::string::_M_erase((ulong)&local_368,0);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&local_1a0,(string *)&local_368,_S_in);
    local_2e8._M_p = (pointer)0x0;
    lVar3 = *(long *)(CONCAT71(local_1a0.first._1_7_,(undefined1)local_1a0.first.line_num_) + -0x18)
    ;
    *(uint *)((long)&local_1a0.first.file_name_._M_string_length + lVar3) =
         *(uint *)((long)&local_1a0.first.file_name_._M_string_length + lVar3) & 0xffffffb5 | 0x40;
    std::istream::_M_extract<long>((long *)&local_1a0);
    if ((local_1a0.first.file_name_.field_2._M_local_buf
         [*(long *)(CONCAT71(local_1a0.first._1_7_,(undefined1)local_1a0.first.line_num_) + -0x18)]
        & 5U) == 0) {
      pvVar7 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                         ((result<toml::detail::region,_toml::detail::none_t> *)&local_290);
      local_2e0 = (undefined1  [8])local_2e8._M_p;
      region::region((region *)local_2d8,pvVar7);
      uVar6 = local_2b8._0_8_;
      uVar5 = local_2d8._16_8_;
      uVar4 = local_2d8._8_8_;
      local_220._24_8_ = &local_1f8;
      local_228 = local_2e0;
      local_220._0_8_ = &PTR__region_001c5698;
      local_2d8._8_8_ = (element_type *)0x0;
      local_2d8._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._24_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_2b8 + 8)) {
        local_1f8._8_8_ = local_2b8._16_8_;
        local_2d8._24_8_ = local_220._24_8_;
      }
      local_1f8._M_allocated_capacity._1_7_ = local_2b8._9_7_;
      local_1f8._M_local_buf[0] = local_2b8[8];
      local_2b8._0_8_ = 0;
      local_2b8[8] = '\0';
      local_1e8._M_allocated_capacity = local_2a0._M_allocated_capacity;
      local_1e8._8_8_ = local_2a0._8_8_;
      __return_storage_ptr__->is_ok_ = true;
      (__return_storage_ptr__->field_1).succ.value.first = (long)local_2e0;
      (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
           (_func_int **)&PTR__region_001c5698;
      local_220._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)uVar4;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
      local_220._8_8_ = (pointer)0x0;
      paVar2 = &(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2;
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
           (pointer)paVar2;
      if (local_2d8._24_8_ == local_220._24_8_) {
        paVar2->_M_allocated_capacity = local_1f8._M_allocated_capacity;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2 + 8) =
             local_1f8._8_8_;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_dataplus._M_p =
             (pointer)local_2d8._24_8_;
        (__return_storage_ptr__->field_1).succ.value.second.source_name_.field_2.
        _M_allocated_capacity = local_1f8._M_allocated_capacity;
      }
      (__return_storage_ptr__->field_1).succ.value.second.source_name_._M_string_length = uVar6;
      local_220._32_8_ = 0;
      local_1f8._M_allocated_capacity = (ulong)(uint7)local_2b8._9_7_ << 8;
      (__return_storage_ptr__->field_1).succ.value.second.first_._M_current =
           (char *)local_2a0._M_allocated_capacity;
      (__return_storage_ptr__->field_1).succ.value.second.last_._M_current = (char *)local_2a0._8_8_
      ;
      local_2d8._24_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_2b8 + 8);
      region::~region((region *)local_220);
      region::~region((region *)local_2d8);
    }
    else {
      location::reset((location *)this,rollback);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_308,"toml::parse_octal_integer:","");
      source_location::source_location((source_location *)local_2e0,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[13],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_228,(source_location *)local_2e0,(char (*) [13])"out of range");
      __l._M_len = 1;
      __l._M_array = (iterator)local_228;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_240,__l,&local_369);
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_328,&local_308,&local_240,&local_1b8,false);
      local_348._16_8_ = local_328._16_8_;
      uVar4 = local_328._8_8_;
      local_348._0_8_ = local_348 + 0x10;
      if ((pointer)local_328._0_8_ == (pointer)((long)local_328 + 0x10U)) {
        p_Stack_330 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_328._24_8_;
        local_328._0_8_ = local_348._0_8_;
      }
      local_328._8_8_ = (_func_int **)0x0;
      local_328._16_8_ = local_328._16_8_ & 0xffffffffffffff00;
      __return_storage_ptr__->is_ok_ = false;
      psVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
      (__return_storage_ptr__->field_1).succ.value.first = (long)psVar1;
      if (local_328._0_8_ == local_348._0_8_) {
        (psVar1->
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        )._M_ptr = (element_type *)local_348._16_8_;
        (__return_storage_ptr__->field_1).succ.value.second.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Stack_330;
      }
      else {
        (__return_storage_ptr__->field_1).succ.value.first = local_328._0_8_;
        (__return_storage_ptr__->field_1).succ.value.second.source_.
        super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_348._16_8_;
      }
      (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
           (_func_int **)uVar4;
      local_348._8_8_ = (pointer)0x0;
      local_348._16_8_ = local_348._16_8_ & 0xffffffffffffff00;
      local_328._0_8_ = (pointer)((long)local_328 + 0x10U);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1b8);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_240);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_p != &local_1c8) {
        operator_delete(local_1d8._M_p,local_1c8._M_allocated_capacity + 1);
      }
      source_location::~source_location((source_location *)local_228);
      source_location::~source_location((source_location *)local_2e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1a0);
    std::ios_base::~ios_base(local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (local_290._0_1_ == true) {
      region::~region(&(((anon_union_72_2_3176b685_for_result<toml::detail::region,_toml::detail::none_t>_3
                          *)local_288)->succ).value);
    }
  }
  else {
    location::reset((location *)this,rollback);
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,"toml::parse_octal_integer:","");
    source_location::source_location((source_location *)local_228,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[33],_true>
              (&local_1a0,(source_location *)local_228,
               (char (*) [33])"the next token is not an integer");
    __l_00._M_len = 1;
    __l_00._M_array = &local_1a0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_348,__l_00,(allocator_type *)&local_308);
    local_328._0_8_ = (pointer)0x0;
    local_328._8_8_ = 0;
    local_328._16_8_ = 0;
    format_underline((string *)local_2e0,&local_368,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_348,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_328,false);
    local_288._8_8_ = local_2d8._8_8_;
    uVar4 = local_2d8._0_8_;
    local_290 = (source_ptr *)
                ((long)&(((anon_union_72_2_3176b685_for_result<toml::detail::region,_toml::detail::none_t>_3
                           *)local_288)->succ).value + 8);
    if (local_2e0 == (undefined1  [8])(local_2d8 + 8)) {
      local_288._16_8_ = local_2d8._16_8_;
      local_2e0 = (undefined1  [8])local_290;
    }
    local_2d8._0_8_ = (_func_int **)0x0;
    local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffffffffff00;
    __return_storage_ptr__->is_ok_ = false;
    psVar1 = &(__return_storage_ptr__->field_1).succ.value.second.source_;
    (__return_storage_ptr__->field_1).succ.value.first = (long)psVar1;
    if (local_2e0 == (undefined1  [8])local_290) {
      (psVar1->
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)local_288._8_8_;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_288._16_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.first = (long)local_2e0;
      (__return_storage_ptr__->field_1).succ.value.second.source_.
      super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_288._8_8_;
    }
    (__return_storage_ptr__->field_1).succ.value.second.super_region_base._vptr_region_base =
         (_func_int **)uVar4;
    local_288._0_8_ = (_func_int **)0x0;
    local_288._8_8_ = local_288._8_8_ & 0xffffffffffffff00;
    local_2e0 = (undefined1  [8])(local_2d8 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_328);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_348);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.second._M_dataplus._M_p != &local_1a0.second.field_2) {
      operator_delete(local_1a0.second._M_dataplus._M_p,
                      local_1a0.second.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_1a0.first);
    source_location::~source_location((source_location *)local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<integer, region>, std::string>
parse_octal_integer(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_oct_int::invoke(loc))
    {
        auto str = token.unwrap().str();
        str.erase(std::remove(str.begin(), str.end(), '_'), str.end());
        str.erase(str.begin()); str.erase(str.begin()); // remove `0o` prefix

        std::istringstream iss(str);
        integer retval(0);
        iss >> std::oct >> retval;
        if(iss.fail())
        {
            // `istream` sets `failbit` if internally-called `std::num_get::get`
            // fails.
            // `std::num_get::get` calls `std::strtoll` if the argument type is
            // signed.
            // `std::strtoll` fails if
            //  - the value is out_of_range or
            //  - no conversion is possible.
            // since we already checked that the string is valid octal integer,
            // so the error reason is out_of_range.
            loc.reset(first);
            return err(format_underline("toml::parse_octal_integer:",
                       {{source_location(loc), "out of range"}}));
        }
        return ok(std::make_pair(retval, token.unwrap()));
    }
    loc.reset(first);
    return err(format_underline("toml::parse_octal_integer:",
               {{source_location(loc), "the next token is not an integer"}}));
}